

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * svg::vectorToString<svg::Circle>
                   (string *__return_storage_ptr__,
                   vector<svg::Circle,_std::allocator<svg::Circle>_> *collection,Layout *layout)

{
  pointer pCVar1;
  uint uVar2;
  ulong uVar3;
  string local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    pCVar1 = (collection->super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(collection->super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x70) <= uVar3)
    break;
    (*pCVar1[uVar3].super_Shape.super_Serializeable._vptr_Serializeable[2])
              (local_50,pCVar1 + uVar3,layout);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_50);
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string vectorToString(std::vector<T> collection, Layout const & layout)
    {
        std::string combination_str;
        for (unsigned i = 0; i < collection.size(); ++i)
            combination_str += collection[i].toString(layout);

        return combination_str;
    }